

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_BigAndOverflow_Test::TestBody(Arena_BigAndOverflow_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  Arena arena;
  AssertHelper local_88;
  long *local_80;
  char *local_78;
  long local_70 [2];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [4];
  Arena local_40;
  
  memt::Arena::Arena(&local_40);
  local_70[0] = 0;
  local_70[1] = 0;
  local_78 = (char *)0x0;
  local_80 = local_70;
  bVar1 = testing::internal::AlwaysTrue();
  if ((bVar1) &&
     ((long)local_40._blocks._block._end - (long)local_40._blocks._block._position != -1)) {
    memt::Arena::growCapacity(&local_40,0xffffffffffffffff);
  }
  std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x142207);
  testing::Message::Message((Message *)local_60);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
             ,0x5a,(char *)local_80);
  testing::internal::AssertHelper::operator=(&local_88,(Message *)local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_60[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  memt::Arena::~Arena(&local_40);
  return;
}

Assistant:

TEST(Arena, BigAndOverflow) {
  memt::Arena arena;
  // aligning size causes overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)), std::bad_alloc);

  // 2x size is an overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 + 1), std::bad_alloc);

  // causes attempt at allocating almost the entire virtual memory space
  // which cannot succeed
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 - 100), std::bad_alloc);

  // sizeof(long) * x overflows to a smaller value (0).
  const size_t smallerOverflow = 1ul << (8*sizeof(long) - 1);
  MEMT_ASSERT(smallerOverflow > 0);
  //ASSERT(smallerOverflow * sizeof(long) == 0); compiler warning
  ASSERT_THROW(arena.allocArray<long>(smallerOverflow), std::bad_alloc);

  // sizeof(int) * x overflows to a greater value
  const size_t greaterOverflow = (~(0ul)) >> 1;
  MEMT_ASSERT(sizeof(long) >= 4);
  //ASSERT(greaterOverflow * sizeof(long) > greaterOverflow); compiler warning
  //ASSERT(greaterOverflow != (greaterOverflow * sizeof(long)) / sizeof(long));
  ASSERT_THROW(arena.allocArray<long>(greaterOverflow), std::bad_alloc);

  ASSERT_TRUE(arena.isEmpty());
}